

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O0

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::WeightedDigraphSPAcyclic
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph)

{
  bool bVar1;
  reference ppRVar2;
  reference ppRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  *__range2_1;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  local_80;
  value_type local_68;
  value_type start_node;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  iterator __end0;
  iterator __begin0;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  *__range2;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  nodes;
  WeightedDigraph<int,_int> *graph_local;
  WeightedDigraphSPAcyclic<int,_int> *this_local;
  
  this->_vptr_WeightedDigraphSPAcyclic = (_func_int **)&PTR__WeightedDigraphSPAcyclic_00116cc0;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::SymbolTable(&this->_edge_to);
  data_structures::SymbolTable<int,_int>::SymbolTable(&this->_weight_to);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::vector(&this->_marked_nodes);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::vector(&this->_reserve_post_nodes);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::clear(&this->_marked_nodes);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::clear(&this->_reserve_post_nodes);
  data_structures::WeightedGraph<int,_int>::getAllNodes
            ((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
              *)&__range2,&graph->super_WeightedGraph<int,_int>);
  __end0 = std::
           vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
           ::begin((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                    *)&__range2);
  node = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *)std::
            vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ::end((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                   *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
                                *)&node);
    if (!bVar1) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
              ::operator*(&__end0);
    start_node = *ppRVar3;
    bVar1 = isInVector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>
                      (&this->_marked_nodes,&start_node);
    if (!bVar1) {
      _dfs(this,start_node);
    }
    __gnu_cxx::
    __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
    ::operator++(&__end0);
  }
  ppRVar2 = std::
            vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ::operator[](&this->_reserve_post_nodes,0);
  local_68 = *ppRVar2;
  this->_start = (local_68->element).key;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::clear(&this->_edge_to);
  data_structures::SymbolTable<int,_int>::clear(&this->_weight_to);
  data_structures::
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  ::WeightedGraphEdge(&local_80,local_68,local_68,0);
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::set(&this->_edge_to,&this->_start,&local_80);
  __range2_1._4_4_ = 0;
  data_structures::SymbolTable<int,_int>::set
            (&this->_weight_to,&this->_start,(int *)((long)&__range2_1 + 4));
  __end0_1 = std::
             vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
             ::begin(&this->_reserve_post_nodes);
  node_1 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)std::
              vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
              ::end(&this->_reserve_post_nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
                        *)&node_1);
    if (!bVar1) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
              ::operator*(&__end0_1);
    _relax(this,graph,*ppRVar3);
    __gnu_cxx::
    __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
    ::operator++(&__end0_1);
  }
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::~vector((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
             *)&__range2);
  return;
}

Assistant:

WeightedDigraphSPAcyclic(WeightedDigraph<T, Weight> &graph) {
            _marked_nodes.clear();
            _reserve_post_nodes.clear();
            auto nodes = graph.getAllNodes();
            // Topological sorting
            for (auto node: nodes) {
                if (!isInVector<Node*>(_marked_nodes, node)) {
                    _dfs(node);
                }
            }

            auto start_node = _reserve_post_nodes[0];
            _start = start_node->element.key;
            _edge_to.clear();
            _weight_to.clear();
            _edge_to.set(_start, Edge(start_node, start_node, Weight()));
            _weight_to.set(_start, Weight());

            for (auto node: _reserve_post_nodes) {
                _relax(graph, node);
            }
        }